

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

char * FIX::integer_to_string<unsigned_long>(char *buf,size_t len,unsigned_long t)

{
  undefined1 auVar1 [16];
  int iVar2;
  type tStack_38;
  unsigned_int pos;
  type number;
  char *p;
  bool isNegative;
  unsigned_long t_local;
  size_t len_local;
  char *buf_local;
  
  tStack_38 = _UNSIGNED_VALUE_OF<unsigned_long>(t);
  number = (type)(buf + len);
  while (99 < tStack_38) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = tStack_38;
    iVar2 = SUB164(auVar1 % ZEXT816(100),0);
    tStack_38 = tStack_38 / 100;
    *(undefined1 *)(number - 1) = digit_pairs[iVar2 * 2 + 1];
    *(undefined1 *)(number - 2) = digit_pairs[(uint)(iVar2 << 1)];
    number = number - 2;
  }
  if (tStack_38 < 10) {
    *(char *)(number - 1) = (char)tStack_38 + '0';
    number = number - 1;
  }
  else {
    *(undefined1 *)(number - 1) = digit_pairs[tStack_38 * 2 + 1];
    *(undefined1 *)(number - 2) = digit_pairs[tStack_38 * 2];
    number = number - 2;
  }
  return (char *)number;
}

Assistant:

inline char *integer_to_string(char *buf, const size_t len, const T t) {
  const bool isNegative = t < 0;
  char *p = buf + len;

  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(t);

  while (number > 99) {
    unsigned_int pos = number % 100;
    number /= 100;

    *--p = digit_pairs[2 * pos + 1];
    *--p = digit_pairs[2 * pos];
  }

  if (number > 9) {
    *--p = digit_pairs[2 * number + 1];
    *--p = digit_pairs[2 * number];
  } else {
    *--p = '0' + char(number);
  }

  if (isNegative) {
    *--p = '-';
  }

  return p;
}